

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O2

utf16 __thiscall
GrcFont::GlyphFromPostscript(GrcFont *this,string *staPostscriptName,GdlObject *pgdlobj,bool fError)

{
  int iVar1;
  string *this_00;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  iVar1 = TtfUtil::PostLookup(this->m_pPost,this->m_cPost,this->m_pMaxp,
                              (staPostscriptName->_M_dataplus)._M_p);
  if (iVar1 < 0) {
    if (fError) {
      if (iVar1 == -2) {
        std::__cxx11::string::string
                  ((string *)&local_50,"No Postscript name data in font",&local_71);
        GrcErrorList::AddError(&g_errorList,0x75,pgdlobj,&local_50);
        this_00 = &local_50;
      }
      else if (iVar1 == -1) {
        std::__cxx11::string::string((string *)&local_30,"Postscript name not found",&local_71);
        GrcErrorList::AddError(&g_errorList,0x74,pgdlobj,&local_30);
        this_00 = &local_30;
      }
      else {
        std::__cxx11::string::string((string *)&local_70,"Postscript name lookup error",&local_71);
        GrcErrorList::AddError(&g_errorList,0x76,pgdlobj,&local_70);
        this_00 = &local_70;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    iVar1 = 0;
  }
  return (utf16)iVar1;
}

Assistant:

utf16 GrcFont::GlyphFromPostscript(std::string staPostscriptName, GdlObject * pgdlobj, bool fError)
{
	Assert(m_pFile);
	Assert(m_pPost);
	Assert(m_pMaxp);

	int nGlyphId = TtfUtil::PostLookup(m_pPost, m_cPost, m_pMaxp, staPostscriptName.c_str());
	if (nGlyphId >= 0)
		return nGlyphId;

	// calling method outputs invalid postscript name
	if (fError)
	{
		if (nGlyphId == -1)
			g_errorList.AddError(116, pgdlobj, "Postscript name not found");
		if (nGlyphId == -2)
			g_errorList.AddError(117, pgdlobj, "No Postscript name data in font");
		if (nGlyphId < -2)
			g_errorList.AddError(118, pgdlobj, "Postscript name lookup error");
	}
	return 0;

}